

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O3

Type miniscript::internal::SanitizeType(Type e)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  uVar1 = e.m_flags & 2;
  iVar2 = (e.m_flags & 1) + (uVar1 >> 1) + (e.m_flags >> 2 & 1) + (uint)((e.m_flags >> 3 & 1) != 0);
  if (iVar2 == 0) {
    e.m_flags = 0;
  }
  else {
    if (iVar2 != 1) {
      __assert_fail("num_types == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x13,"Type miniscript::internal::SanitizeType(Type)");
    }
    uVar3 = ~e.m_flags;
    if ((e.m_flags & 0x10) == 0) {
      if ((uVar3 & 0x48) == 0) {
        __assert_fail("!(e << \"n\"_mst) || !(e << \"W\"_mst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x16,"Type miniscript::internal::SanitizeType(Type)");
      }
    }
    else {
      if ((e.m_flags & 0x20) != 0) {
        __assert_fail("!(e << \"z\"_mst) || !(e << \"o\"_mst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x14,"Type miniscript::internal::SanitizeType(Type)");
      }
      if ((e.m_flags & 0x40) != 0) {
        __assert_fail("!(e << \"n\"_mst) || !(e << \"z\"_mst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x15,"Type miniscript::internal::SanitizeType(Type)");
      }
    }
    if ((uVar3 & 0x82) == 0) {
      __assert_fail("!(e << \"V\"_mst) || !(e << \"d\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x17,"Type miniscript::internal::SanitizeType(Type)");
    }
    if ((e.m_flags & 0x104) == 4) {
      __assert_fail("!(e << \"K\"_mst) || (e << \"u\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x18,"Type miniscript::internal::SanitizeType(Type)");
    }
    if ((uVar1 != 0) && ((e.m_flags >> 8 & 1) != 0)) {
      __assert_fail("!(e << \"V\"_mst) || !(e << \"u\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x19,"Type miniscript::internal::SanitizeType(Type)");
    }
    if ((e.m_flags >> 9 & 1) != 0) {
      if ((e.m_flags >> 10 & 1) != 0) {
        __assert_fail("!(e << \"e\"_mst) || !(e << \"f\"_mst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x1a,"Type miniscript::internal::SanitizeType(Type)");
      }
      if (-1 < (char)e.m_flags) {
        __assert_fail("!(e << \"e\"_mst) || (e << \"d\"_mst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x1b,"Type miniscript::internal::SanitizeType(Type)");
      }
      if (uVar1 != 0) {
        __assert_fail("!(e << \"V\"_mst) || !(e << \"e\"_mst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                      ,0x1c,"Type miniscript::internal::SanitizeType(Type)");
      }
    }
    if ((uVar3 & 0x480) == 0) {
      __assert_fail("!(e << \"d\"_mst) || !(e << \"f\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x1d,"Type miniscript::internal::SanitizeType(Type)");
    }
    if ((e.m_flags & 0x402) == 2) {
      __assert_fail("!(e << \"V\"_mst) || (e << \"f\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x1e,"Type miniscript::internal::SanitizeType(Type)");
    }
    if ((e.m_flags & 0x804) == 4) {
      __assert_fail("!(e << \"K\"_mst) || (e << \"s\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x1f,"Type miniscript::internal::SanitizeType(Type)");
    }
    if ((e.m_flags & 0x1010) == 0x10) {
      __assert_fail("!(e << \"z\"_mst) || (e << \"m\"_mst)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                    ,0x20,"Type miniscript::internal::SanitizeType(Type)");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Type)e.m_flags;
  }
  __stack_chk_fail();
}

Assistant:

Type SanitizeType(Type e) {
    int num_types = (e << "K"_mst) + (e << "V"_mst) + (e << "B"_mst) + (e << "W"_mst);
    if (num_types == 0) return ""_mst; // No valid type, don't care about the rest
    assert(num_types == 1); // K, V, B, W all conflict with each other
    assert(!(e << "z"_mst) || !(e << "o"_mst)); // z conflicts with o
    assert(!(e << "n"_mst) || !(e << "z"_mst)); // n conflicts with z
    assert(!(e << "n"_mst) || !(e << "W"_mst)); // n conflicts with W
    assert(!(e << "V"_mst) || !(e << "d"_mst)); // V conflicts with d
    assert(!(e << "K"_mst) ||  (e << "u"_mst)); // K implies u
    assert(!(e << "V"_mst) || !(e << "u"_mst)); // V conflicts with u
    assert(!(e << "e"_mst) || !(e << "f"_mst)); // e conflicts with f
    assert(!(e << "e"_mst) ||  (e << "d"_mst)); // e implies d
    assert(!(e << "V"_mst) || !(e << "e"_mst)); // V conflicts with e
    assert(!(e << "d"_mst) || !(e << "f"_mst)); // d conflicts with f
    assert(!(e << "V"_mst) ||  (e << "f"_mst)); // V implies f
    assert(!(e << "K"_mst) ||  (e << "s"_mst)); // K implies s
    assert(!(e << "z"_mst) ||  (e << "m"_mst)); // z implies m
    return e;
}